

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

void Extra_bddPermuteArray
               (DdManager *manager,DdNode **bNodesIn,DdNode **bNodesOut,int nNodes,int *permut)

{
  int *piVar1;
  DdHashTable *table;
  DdNode *pDVar2;
  ulong uVar3;
  ulong uVar4;
  
  do {
    manager->reordered = 0;
    table = cuddHashTableInit(manager,1,2);
    if (0 < nNodes) {
      uVar3 = 0;
      do {
        pDVar2 = cuddBddPermuteRecur(manager,table,bNodesIn[uVar3],permut);
        bNodesOut[uVar3] = pDVar2;
        if (pDVar2 == (DdNode *)0x0) {
          if (uVar3 != 0) {
            uVar4 = 0;
            do {
              Cudd_RecursiveDeref(manager,bNodesOut[uVar4]);
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
          }
          break;
        }
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        uVar3 = uVar3 + 1;
      } while ((uint)nNodes != uVar3);
    }
    cuddHashTableQuit(table);
    if (manager->reordered != 1) {
      return;
    }
  } while( true );
}

Assistant:

void Extra_bddPermuteArray( DdManager * manager, DdNode ** bNodesIn, DdNode ** bNodesOut, int nNodes, int *permut )
{
	DdHashTable *table;
	int i, k;
	do
	{
		manager->reordered = 0;
		table = cuddHashTableInit( manager, 1, 2 );

		/* permute the output functions one-by-one */
		for ( i = 0; i < nNodes; i++ )
		{
			bNodesOut[i] = cuddBddPermuteRecur( manager, table, bNodesIn[i], permut );
			if ( bNodesOut[i] == NULL )
			{
				/* deref the array of the already computed outputs */
				for ( k = 0; k < i; k++ )
					Cudd_RecursiveDeref( manager, bNodesOut[k] );
				break;
			}
			cuddRef( bNodesOut[i] );
		}
		/* Dispose of local cache. */
		cuddHashTableQuit( table );
	}
	while ( manager->reordered == 1 );
}